

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O3

FMformat_order FMformat_cmp(FMFormat_conflict format1,FMFormat_conflict format2)

{
  char *pcVar1;
  char *__s2;
  FMFormat_conflict format1_00;
  char **ppcVar2;
  int iVar3;
  FMformat_order FVar4;
  FMFieldList list;
  FMFieldList list_00;
  FMFieldList p_Var5;
  long lVar6;
  FMFormat_conflict *__ptr;
  FMFormat_conflict *__ptr_00;
  int iVar7;
  FMformat_order FVar8;
  FMformat_order FVar9;
  FMFieldList p_Var10;
  FMFormat_conflict format2_00;
  size_t __nmemb;
  FMFormat_conflict *pp_Var11;
  size_t __nmemb_00;
  size_t sVar12;
  long lVar13;
  int iVar14;
  FMFormat_conflict *pp_Var15;
  bool bVar16;
  
  list = copy_field_list(format1->field_list);
  list_00 = copy_field_list(format2->field_list);
  __nmemb = 0xffffffffffffffff;
  p_Var5 = list;
  do {
    __nmemb = __nmemb + 1;
    ppcVar2 = &p_Var5->field_name;
    p_Var5 = p_Var5 + 1;
  } while (*ppcVar2 != (char *)0x0);
  __nmemb_00 = 0xffffffffffffffff;
  p_Var5 = list_00;
  do {
    __nmemb_00 = __nmemb_00 + 1;
    ppcVar2 = &p_Var5->field_name;
    p_Var5 = p_Var5 + 1;
  } while (*ppcVar2 != (char *)0x0);
  qsort(list,__nmemb,0x18,field_name_compar);
  qsort(list_00,__nmemb_00,0x18,field_name_compar);
  if (__nmemb_00 == 0 || __nmemb == 0) {
    FVar9 = Format_Greater;
    if (__nmemb == 0) {
      FVar9 = (uint)(__nmemb_00 == 0) * 2;
    }
  }
  else {
    FVar9 = Format_Equal;
    iVar7 = 0;
    iVar14 = 0;
    do {
      sVar12 = (size_t)iVar14;
      p_Var5 = list + sVar12;
      pcVar1 = list[sVar12].field_name;
      lVar6 = (long)iVar7;
      p_Var10 = list_00 + lVar6;
      __s2 = list_00[lVar6].field_name;
      iVar3 = strcmp(pcVar1,__s2);
      if (iVar3 == 0) {
        iVar3 = field_type_eq(p_Var5->field_type,p_Var10->field_type);
        if (iVar3 == 0) {
          return Format_Incompatible;
        }
      }
      else if (iVar3 < 0) {
        if (FVar9 == Format_Less) {
LAB_0011d537:
          __ptr = (FMFormat_conflict *)0x0;
          __ptr_00 = (FMFormat_conflict *)0x0;
          FVar4 = Format_Incompatible;
          goto LAB_0011d547;
        }
        iVar14 = iVar14 + -1;
        while (iVar3 = strcmp(p_Var5->field_name,__s2), iVar3 < 0) {
          sVar12 = sVar12 + 1;
          iVar14 = iVar14 + 1;
          p_Var5 = p_Var5 + 1;
          if (__nmemb == sVar12) goto LAB_0011d537;
        }
        iVar7 = iVar7 + -1;
        FVar9 = Format_Greater;
      }
      else {
        if (FVar9 == Format_Greater) {
          __ptr = (FMFormat_conflict *)0x0;
          __ptr_00 = (FMFormat_conflict *)0x0;
          FVar4 = Format_Incompatible;
          goto LAB_0011d547;
        }
        lVar13 = 0;
        while (iVar3 = strcmp(pcVar1,p_Var10->field_name), 0 < iVar3) {
          lVar13 = lVar13 + -1;
          p_Var10 = p_Var10 + 1;
          if (lVar6 - __nmemb_00 == lVar13) goto LAB_0011d537;
        }
        iVar14 = iVar14 + -1;
        iVar7 = ~(uint)lVar13 + iVar7;
        FVar9 = Format_Less;
      }
      iVar14 = iVar14 + 1;
      iVar7 = iVar7 + 1;
    } while ((iVar14 < (int)__nmemb) && (iVar7 < (int)__nmemb_00));
    if (iVar14 < (int)__nmemb) {
      bVar16 = FVar9 == Format_Less;
      FVar9 = Format_Greater;
      if (bVar16) {
LAB_0011d5a5:
        __ptr_00 = (FMFormat_conflict *)0x0;
        FVar4 = Format_Incompatible;
        __ptr = (FMFormat_conflict *)0x0;
        goto LAB_0011d547;
      }
    }
    else if (iVar7 < (int)__nmemb_00) {
      if (FVar9 == Format_Greater) goto LAB_0011d5a5;
      FVar9 = Format_Less;
    }
  }
  __ptr = get_subformats_IOformat(format1);
  __ptr_00 = get_subformats_IOformat(format2);
  format1_00 = *__ptr;
  pp_Var11 = __ptr;
  while (FVar4 = FVar9, format1_00 != (FMFormat_conflict)0x0) {
    FVar8 = FVar9;
    if ((format1_00 != format1) && (format2_00 = *__ptr_00, format2_00 != (FMFormat_conflict)0x0)) {
      pcVar1 = format1_00->format_name;
      pp_Var15 = __ptr_00;
      do {
        pp_Var15 = pp_Var15 + 1;
        iVar7 = strcmp(pcVar1,format2_00->format_name);
        if (iVar7 == 0) {
          FVar4 = FMformat_cmp(format1_00,format2_00);
          if (FVar4 != Format_Equal) {
            if (FVar4 == Format_Incompatible) goto LAB_0011d547;
            FVar8 = FVar4;
            if ((FVar9 != Format_Equal) && (FVar8 = FVar9, FVar9 != FVar4)) {
              FVar4 = Format_Incompatible;
              goto LAB_0011d547;
            }
          }
          break;
        }
        format2_00 = *pp_Var15;
      } while (format2_00 != (FMFormat_conflict)0x0);
    }
    pp_Var15 = pp_Var11 + 1;
    pp_Var11 = pp_Var11 + 1;
    FVar9 = FVar8;
    format1_00 = *pp_Var15;
  }
LAB_0011d547:
  free_field_list(list);
  free_field_list(list_00);
  if (__ptr != (FMFormat_conflict *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (FMFormat_conflict *)0x0) {
    free(__ptr_00);
  }
  return FVar4;
}

Assistant:

FMformat_order
FMformat_cmp(FMFormat format1, FMFormat format2)
{
    FMformat_order tmp_result = Format_Equal;
    FMFieldList field_list1 =
	copy_field_list(field_list_of_IOformat(format1));
    FMFieldList field_list2 =
	copy_field_list(field_list_of_IOformat(format2));
    FMFormat *subformats1 = NULL, *subformats2 = NULL, *tmp_subformats = NULL;
    int field_count1, field_count2;
    int i, j, limit;

    /* count fields */
    for (field_count1 = 0; field_list1[field_count1].field_name != NULL;
	 field_count1++);

    /* count fields */
    for (field_count2 = 0; field_list2[field_count2].field_name != NULL;
	 field_count2++);

    qsort(field_list1, field_count1, sizeof(FMField), field_name_compar);
    qsort(field_list2, field_count2, sizeof(FMField), field_name_compar);

    limit = field_count1;
    if (field_count2 < limit)
	limit = field_count2;
    i = j = 0;
    while ((i < field_count1) && (j < field_count2)) {
	int name_cmp;
	if ((name_cmp = strcmp(field_list1[i].field_name,
			       field_list2[j].field_name)) == 0) {
	    /* fields have same name */
	    if (!field_type_eq(field_list1[i].field_type,
				  field_list2[j].field_type)) {
		return Format_Incompatible;
	    }
	} else if (name_cmp < 0) {
	    /* name_cmp>0  a field in field_list1 that doesn't appear in 2 */
	    if (tmp_result == Format_Less) {
		/* we previously found the opposite */
		tmp_result = Format_Incompatible;
		goto free_lists;
	    } else {
		/* tentatively decide that list1 is a superset of 2 */
		tmp_result = Format_Greater;
	    }
	    /* skip fields in 1 until we find the next field in 2 */
	    while (strcmp(field_list1[i].field_name,
			  field_list2[j].field_name) < 0) {
		i++;
		if (i == field_count1) {
		    /* didn't find one */
		    tmp_result = Format_Incompatible;
		    goto free_lists;
		}
	    }
	    i--;
	    j--;
	} else {
	    /* name_cmp>0  a field in field_list2 that doesn't appear in 1 */
	    if (tmp_result == Format_Greater) {
		tmp_result = Format_Incompatible;
		goto free_lists;
	    } else {
		tmp_result = Format_Less;
	    }
	    /* skip fields in field_list2 until we find matching */
	    while (strcmp(field_list1[i].field_name,
			  field_list2[j].field_name) > 0) {
		j++;
		if (j == field_count2) {
		    /* didn't find one */
		    tmp_result = Format_Incompatible;
		    goto free_lists;
		}
	    }
	    i--;
	    j--;
	}
	i++;
	j++;
    }
    if (i < field_count1) {
	if (tmp_result == Format_Less) {
	    tmp_result = Format_Incompatible;
	    goto free_lists;
	} else {
	    tmp_result = Format_Greater;
	}
    } else if (j < field_count2) {
	if (tmp_result == Format_Greater) {
	    tmp_result = Format_Incompatible;
	    goto free_lists;
	} else {
	    tmp_result = Format_Less;
	}
    }
    /* go through subformats */
    tmp_subformats = subformats1 = get_subformats_IOformat(format1);
    subformats2 = get_subformats_IOformat(format2);

    while (*subformats1 != NULL) {
	char *sub1_name = name_of_FMformat(*subformats1);
	int i = 0;
	if (*subformats1 == format1) {
	    /* self appears in subformat list, skip it */
	    subformats1++;
	    continue;
	}
	while (subformats2[i] != NULL) {
	    if (strcmp(sub1_name, name_of_FMformat(subformats2[i])) == 0) {
		/* same name, compare */
		FMformat_order sub_result;
		sub_result = FMformat_cmp(*subformats1,
					  subformats2[i]);
		if (sub_result == Format_Incompatible) {
		    tmp_result = Format_Incompatible;
		    goto free_lists;
		}
		if (sub_result != Format_Equal) {
		    /* subformats are not equal! */
		    if (tmp_result == Format_Equal) {
			/* we thought they were equal before */
			tmp_result = sub_result;
		    } else if (tmp_result != sub_result) {
			tmp_result = Format_Incompatible;
			goto free_lists;
		    }
		}
		break;
	    }
	    i++;
	}
	subformats1++;
    }

 free_lists:
    free_field_list(field_list1);
    free_field_list(field_list2);
    if (tmp_subformats) free(tmp_subformats);
    if (subformats2) free(subformats2);
    return tmp_result;
}